

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O0

QString * QXkbCommon::lookupStringNoKeysymTransformations(xkb_keysym_t keysym)

{
  int iVar1;
  char *pcVar2;
  size_type sVar3;
  undefined4 in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int size;
  QVarLengthArray<char,_32LL> chars;
  qsizetype in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QString *utf8;
  QVLABaseBase local_40 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  utf8 = in_RDI;
  memset(local_40,0xaa,0x38);
  QVarLengthArray<char,_32LL>::QVarLengthArray
            ((QVarLengthArray<char,_32LL> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
            );
  pcVar2 = QVLABase<char>::data((QVLABase<char> *)local_40);
  sVar3 = QVLABaseBase::size(local_40);
  iVar1 = xkb_keysym_to_utf8(in_ESI,pcVar2,sVar3);
  if (iVar1 == 0) {
    QString::QString((QString *)0xb3e3ec);
  }
  else {
    sVar3 = QVLABaseBase::size(local_40);
    if (sVar3 < iVar1) {
      QVarLengthArray<char,_32LL>::resize
                ((QVarLengthArray<char,_32LL> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
      pcVar2 = QVLABase<char>::data((QVLABase<char> *)local_40);
      sVar3 = QVLABaseBase::size(local_40);
      xkb_keysym_to_utf8(in_ESI,pcVar2,sVar3);
      in_stack_ffffffffffffff74 = in_ESI;
    }
    QVarLengthArray<char,_32LL>::constData((QVarLengthArray<char,_32LL> *)0xb3e470);
    QString::fromUtf8((char *)utf8,(qsizetype)in_RDI);
  }
  QVarLengthArray<char,_32LL>::~QVarLengthArray
            ((QVarLengthArray<char,_32LL> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return utf8;
}

Assistant:

QString QXkbCommon::lookupStringNoKeysymTransformations(xkb_keysym_t keysym)
{
    QVarLengthArray<char, 32> chars(32);
    const int size = xkb_keysym_to_utf8(keysym, chars.data(), chars.size());
    if (size == 0)
        return QString(); // the keysym does not have a Unicode representation

    if (Q_UNLIKELY(size > chars.size())) {
        chars.resize(size);
        xkb_keysym_to_utf8(keysym, chars.data(), chars.size());
    }
    return QString::fromUtf8(chars.constData(), size - 1);
}